

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,ON_3dPoint *B,double *pivot)

{
  ulong uVar1;
  double **ppdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ***pppdVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ON_3dPoint *this_00;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  ON_3dPoint t;
  double local_e8;
  ON_3dPoint *local_c8;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  uVar8 = this->m_row_count;
  pppdVar6 = &this->m;
  if (uVar8 == (this->m_rowmem).m_count) {
    pppdVar6 = &(this->m_rowmem).m_a;
  }
  uVar12 = this->m_col_count;
  if ((int)uVar8 < this->m_col_count) {
    uVar12 = uVar8;
  }
  if ((int)uVar12 < 1) {
    uVar15 = 0;
    uVar16 = 0;
    iVar10 = 0;
  }
  else {
    ppdVar2 = *pppdVar6;
    local_c8 = B + 1;
    local_e8 = 0.0;
    uVar14 = 1;
    uVar11 = 0;
    do {
      onmalloc(0);
      pdVar7 = ppdVar2[uVar11];
      dVar17 = pdVar7[uVar11];
      uVar15 = SUB84(dVar17,0);
      uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      dVar17 = ABS(dVar17);
      uVar1 = uVar11 + 1;
      if ((long)uVar1 < (long)this->m_row_count) {
        uVar13 = uVar11 & 0xffffffff;
        uVar9 = uVar14;
        do {
          if (dVar17 < ABS(ppdVar2[uVar9][uVar11])) {
            uVar13 = uVar9 & 0xffffffff;
            dVar17 = ABS(ppdVar2[uVar9][uVar11]);
          }
          uVar9 = uVar9 + 1;
        } while ((uint)this->m_row_count != uVar9);
      }
      else {
        uVar13 = uVar11 & 0xffffffff;
      }
      dVar18 = dVar17;
      if ((uVar11 != 0) && (local_e8 <= dVar17)) {
        dVar18 = local_e8;
      }
      if (dVar17 <= zero_tolerance) goto LAB_004f25f2;
      iVar10 = (int)uVar13;
      if (uVar11 != uVar13) {
        SwapRows(this,iVar10,(uint)uVar11);
        dVar17 = B[iVar10].z;
        dVar3 = B[iVar10].x;
        dVar4 = B[iVar10].y;
        B[iVar10].z = B[uVar11].z;
        dVar5 = B[uVar11].y;
        B[iVar10].x = B[uVar11].x;
        B[iVar10].y = dVar5;
        B[uVar11].z = dVar17;
        B[uVar11].x = dVar3;
        B[uVar11].y = dVar4;
        pdVar7 = ppdVar2[uVar11];
        uVar15 = SUB84(pdVar7[uVar11],0);
        uVar16 = (undefined4)((ulong)pdVar7[uVar11] >> 0x20);
      }
      dVar17 = 1.0 / (double)CONCAT44(uVar16,uVar15);
      pdVar7[uVar11] = 1.0;
      uVar8 = ~(uint)uVar11;
      ON_ArrayScale(this->m_col_count + uVar8,dVar17,pdVar7 + uVar1,pdVar7 + uVar1);
      ON_3dPoint::operator*=(B + uVar11,dVar17);
      uVar9 = (ulong)this->m_row_count;
      uVar13 = uVar14;
      this_00 = local_c8;
      if ((long)uVar1 < (long)uVar9) {
        do {
          pdVar7 = ppdVar2[uVar13];
          dVar17 = pdVar7[uVar11];
          pdVar7[uVar11] = 0.0;
          if (zero_tolerance < ABS(dVar17)) {
            dVar17 = (double)((ulong)dVar17 ^ (ulong)DAT_006994b0);
            ON_Array_aA_plus_B(this->m_col_count + uVar8,dVar17,ppdVar2[uVar11] + uVar1,
                               pdVar7 + uVar1,pdVar7 + uVar1);
            ::operator*(&local_60,dVar17,B + uVar11);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator+=(this_00,&local_48);
            uVar9 = (ulong)(uint)this->m_row_count;
          }
          uVar13 = uVar13 + 1;
          this_00 = this_00 + 1;
        } while ((int)uVar13 < (int)uVar9);
      }
      uVar14 = uVar14 + 1;
      local_c8 = local_c8 + 1;
      uVar11 = uVar1;
      local_e8 = dVar18;
    } while (uVar1 != uVar12);
    uVar11 = (ulong)uVar12;
LAB_004f25f2:
    iVar10 = (int)uVar11;
    uVar15 = SUB84(dVar18,0);
    uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
  }
  if (pivot != (double *)0x0) {
    *pivot = (double)CONCAT44(uVar16,uVar15);
  }
  return iVar10;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    ON_3dPoint* B,
    double* pivot 
    )
{
  ON_3dPoint t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    //onfree( onmalloc( 1)); // 8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}